

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O2

double __thiscall
TasGrid::GridLocalPolynomial::evalBasisSupported<(TasGrid::RuleLocal::erule)1>
          (GridLocalPolynomial *this,int *point,double *x,bool *isSupported)

{
  int j;
  long lVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = RuleLocal::evalSupport<(TasGrid::RuleLocal::erule)1>(this->order,*point,*x,isSupported);
  dVar3 = 0.0;
  if (*isSupported == true) {
    dVar3 = dVar2;
    for (lVar1 = 1; lVar1 < (this->super_BaseCanonicalGrid).num_dimensions; lVar1 = lVar1 + 1) {
      dVar2 = RuleLocal::evalSupport<(TasGrid::RuleLocal::erule)1>
                        (this->order,point[lVar1],x[lVar1],isSupported);
      if (*isSupported != true) {
        return 0.0;
      }
      dVar3 = dVar3 * dVar2;
    }
  }
  return dVar3;
}

Assistant:

double evalBasisSupported(const int point[], const double x[], bool &isSupported) const{
        double f = RuleLocal::evalSupport<eff_rule>(order, point[0], x[0], isSupported);
        if (!isSupported) return 0.0;
        for(int j=1; j<num_dimensions; j++){
            f *= RuleLocal::evalSupport<eff_rule>(order, point[j], x[j], isSupported);
            if (!isSupported) return 0.0;
        }
        return f;
    }